

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satTruth.c
# Opt level: O0

int * Tru_ManLookup(Tru_Man_t *p,word *pTruth)

{
  uint uVar1;
  int iVar2;
  int *local_30;
  int *pSpot;
  Tru_One_t *pEntry;
  word *pTruth_local;
  Tru_Man_t *p_local;
  
  if ((*pTruth & 1) == 0) {
    local_30 = p->pTable;
    uVar1 = Tru_ManHash(pTruth,p->nWords,p->nTableSize,Tru_ManLookup::s_Primes);
    local_30 = local_30 + uVar1;
    pSpot = &Tru_ManReadOne(p,*local_30)->Handle;
    while ((pSpot != (int *)0x0 &&
           (iVar2 = Tru_ManEqual((word *)(pSpot + 2),pTruth,p->nWords), iVar2 == 0))) {
      local_30 = pSpot + 1;
      pSpot = &Tru_ManReadOne(p,*local_30)->Handle;
    }
    return local_30;
  }
  __assert_fail("(pTruth[0] & 1) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satTruth.c"
                ,0x62,"int *Tru_ManLookup(Tru_Man_t *, word *)");
}

Assistant:

int * Tru_ManLookup( Tru_Man_t * p, word * pTruth )
{
    static int s_Primes[10] = { 1291, 1699, 2357, 4177, 5147, 5647, 6343, 7103, 7873, 8147 };
    Tru_One_t * pEntry;
    int * pSpot;
    assert( (pTruth[0] & 1) == 0 );
    pSpot = p->pTable + Tru_ManHash( pTruth, p->nWords, p->nTableSize, s_Primes );
    for ( pEntry = Tru_ManReadOne(p, *pSpot); pEntry; pSpot = &pEntry->Next, pEntry = Tru_ManReadOne(p, *pSpot) )
        if ( Tru_ManEqual(pEntry->pTruth, pTruth, p->nWords) )
            return pSpot;
    return pSpot;
}